

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void assembler(istream *input,ostream *output)

{
  Tokenizer tkz;
  Assembler ab;
  Error err;
  vector<Token,_std::allocator<Token>_> local_460;
  Tokenizer local_448;
  Assembler local_410;
  Analyser local_378;
  Analyser local_1c8;
  
  local_448._initialized = false;
  local_448._lines_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448._lines_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448._lines_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448._ptr.first = 0;
  local_448._ptr.second = 0;
  local_448._rdr = input;
  Tokenizer::Tokenize(&local_460,&local_448);
  Analyser::Analyser(&local_378,&local_460);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_460);
  Analyser::Analyse(&local_378);
  Analyser::Analyser(&local_1c8,&local_378);
  Assembler::Assembler(&local_410,output,&local_1c8);
  Analyser::~Analyser(&local_1c8);
  Assembler::Assemble(&local_410);
  Assembler::~Assembler(&local_410);
  Analyser::~Analyser(&local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448._lines_buffer);
  return;
}

Assistant:

void assembler(std::istream& input, std::ostream& output) {
	try {
		Tokenizer tkz(input);
		Analyser as(tkz.Tokenize());
		as.Analyse();
		Assembler ab(output, as);
		ab.Assemble();
	}
	catch (Error err) {
		err.printErrorMessage();
	}
}